

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O0

ostream * operator<<(ostream *out,value_t t)

{
  undefined1 in_SIL;
  ostream *in_RDI;
  
  switch(in_SIL) {
  case 0:
    std::operator<<(in_RDI,"null");
    break;
  case 1:
    std::operator<<(in_RDI,"object");
    break;
  case 2:
    std::operator<<(in_RDI,"array");
    break;
  case 3:
    std::operator<<(in_RDI,"string");
    break;
  case 4:
    std::operator<<(in_RDI,"boolean");
    break;
  case 5:
    std::operator<<(in_RDI,"number_integer");
    break;
  case 6:
    std::operator<<(in_RDI,"number_unsigned");
    break;
  case 7:
    std::operator<<(in_RDI,"number_float");
    break;
  case 8:
    std::operator<<(in_RDI,"discarded");
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<< (std::ostream& out, Json::value_t t) {
	switch (t) {
		case Json::value_t::null: out << "null"; break;
		case Json::value_t::object: out << "object"; break;
		case Json::value_t::array: out << "array"; break;
		case Json::value_t::string: out << "string"; break;
		case Json::value_t::boolean: out << "boolean"; break;
		case Json::value_t::number_integer: out << "number_integer"; break;
		case Json::value_t::number_unsigned: out << "number_unsigned"; break;
		case Json::value_t::number_float: out << "number_float"; break;
		case Json::value_t::discarded: out << "discarded"; break;
	}
	return out;
}